

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

size_type __thiscall lf::mesh::hybrid2d::Mesh::NumEntities(Mesh *this,uint codim)

{
  size_type sVar1;
  runtime_error *this_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (codim == 2) {
    sVar1 = (size_type)
            ((long)(this->points_).
                   super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->points_).
                   super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  else if (codim == 1) {
    sVar1 = (int)((long)(this->segments_).
                        super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->segments_).
                        super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  }
  else {
    if (codim != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"codim out of bounds.",0x14);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_1e0,&local_200,0x3a,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar1 = (int)((long)(this->quads_).
                        super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->quads_).
                        super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x49249249 +
            (int)((long)(this->trias_).
                        super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->trias_).
                        super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x55555555;
  }
  return sVar1;
}

Assistant:

Mesh::size_type Mesh::NumEntities(unsigned codim) const {
  switch (codim) {
    case 0:
      return trias_.size() + quads_.size();
    case 1:
      return segments_.size();
    case 2:
      return points_.size();
    default:
      LF_VERIFY_MSG(false, "codim out of bounds.");
  }
}